

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasdreamOptimizationTests.cpp
# Opt level: O3

bool TasOptimization::testGradientDescent(bool verbose)

{
  undefined1 auVar1 [16];
  pointer pdVar2;
  pointer pdVar3;
  undefined1 (*pauVar4) [16];
  int i;
  long lVar5;
  int iVar6;
  bool bVar7;
  char *pcVar8;
  undefined7 in_register_00000039;
  value_type_conflict1 *__val;
  undefined1 auVar9 [16];
  ProjectionFunctionSingle proj;
  GradientDescentState state;
  vector<double,_std::allocator<double>_> x0;
  GradientFunctionSingle grad;
  ObjectiveFunctionSingle func;
  vector<double,_std::allocator<double>_> local_138;
  vector<double,_std::allocator<double>_> local_118;
  code *local_100;
  undefined1 local_f8 [8];
  vector<double,_std::allocator<double>_> local_f0;
  vector<double,_std::allocator<double>_> local_d8;
  undefined1 (*local_b8) [16];
  undefined4 local_ac;
  undefined1 local_a8 [16];
  pointer local_98;
  _Any_data local_88;
  undefined1 local_78 [16];
  _Any_data local_68;
  undefined1 local_58 [16];
  vector<double,_std::allocator<double>_> local_48;
  long lVar10;
  
  local_58 = (undefined1  [16])0x0;
  local_68 = (_Any_data)0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (_Any_data)0x0;
  pauVar4 = (undefined1 (*) [16])operator_new(0x58);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)(pauVar4[5] + 8);
  pauVar4[4] = (undefined1  [16])0x0;
  pauVar4[3] = (undefined1  [16])0x0;
  pauVar4[2] = (undefined1  [16])0x0;
  pauVar4[1] = (undefined1  [16])0x0;
  *pauVar4 = (undefined1  [16])0x0;
  *(undefined8 *)pauVar4[5] = 0;
  local_b8 = pauVar4;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)pauVar4;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  makeNesterovTestFunction
            (10.0,5,(ObjectiveFunctionSingle *)&local_68,(GradientFunctionSingle *)&local_88,
             &local_48);
  local_a8 = (undefined1  [16])0x0;
  local_98 = (pointer)0x0;
  local_a8._0_8_ = operator_new(0x58);
  local_98 = (pointer)(*(undefined1 (*) [16])(local_a8._0_8_ + 0x50) + 8);
  *(undefined8 *)*(undefined1 (*) [16])(local_a8._0_8_ + 0x50) = 0;
  *(undefined1 (*) [16])(local_a8._0_8_ + 0x40) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(local_a8._0_8_ + 0x30) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(local_a8._0_8_ + 0x20) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])(local_a8._0_8_ + 0x10) = (undefined1  [16])0x0;
  *(undefined1 (*) [16])local_a8._0_8_ = (undefined1  [16])0x0;
  local_a8._8_8_ = local_98;
  local_f8 = (undefined1  [8])0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_f0,(vector<double,_std::allocator<double>_> *)local_a8);
  TasOptimization::GradientDescent(local_88._M_pod_data,0.1,300,1e-06,(vector *)&local_f0);
  local_ac = (undefined4)CONCAT71(in_register_00000039,verbose);
  std::vector<double,_std::allocator<double>_>::vector(&local_138,&local_f0);
  bVar7 = true;
  lVar5 = 0;
  do {
    bVar7 = (bool)(bVar7 & ABS(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar5] -
                               *(double *)(*pauVar4 + lVar5 * 8)) <= 1e-06);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xb);
  GradientDescentState::setX
            ((GradientDescentState *)local_f8,(vector<double,_std::allocator<double>_> *)local_a8);
  iVar6 = 300;
  do {
    TasOptimization::GradientDescent(local_88._M_pod_data,0.1,1,1e-06,(vector *)&local_f0);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  std::vector<double,_std::allocator<double>_>::vector(&local_118,&local_f0);
  pdVar3 = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pdVar2 = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((pdVar2 != (pointer)0x0) &&
     (operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2),
     local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start != (pointer)0x0)) {
    operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar5 = 0;
  do {
    bVar7 = (bool)(bVar7 & ABS(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar5] -
                               *(double *)(*pauVar4 + lVar5 * 8)) <= 1e-06);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xb);
  local_f8 = (undefined1  [8])0x3ff0000000000000;
  GradientDescentState::setX
            ((GradientDescentState *)local_f8,(vector<double,_std::allocator<double>_> *)local_a8);
  TasOptimization::GradientDescent
            (local_68._M_pod_data,local_88._M_pod_data,1.5,1.25,300,1e-06,
             (GradientDescentState *)local_f8);
  std::vector<double,_std::allocator<double>_>::vector(&local_118,&local_f0);
  pdVar3 = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pdVar2 = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((pdVar2 != (pointer)0x0) &&
     (operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2),
     local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start != (pointer)0x0)) {
    operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar5 = 0;
  do {
    bVar7 = (bool)(bVar7 & ABS(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar5] -
                               *(double *)(*pauVar4 + lVar5 * 8)) <= 1e-06);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xb);
  GradientDescentState::setX
            ((GradientDescentState *)local_f8,(vector<double,_std::allocator<double>_> *)local_a8);
  iVar6 = 300;
  do {
    TasOptimization::GradientDescent
              (local_68._M_pod_data,local_88._M_pod_data,1.5,1.25,1,1e-06,
               (GradientDescentState *)local_f8);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  std::vector<double,_std::allocator<double>_>::vector(&local_118,&local_f0);
  pauVar4 = local_b8;
  pdVar3 = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pdVar2 = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((pdVar2 != (pointer)0x0) &&
     (operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2),
     local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start != (pointer)0x0)) {
    operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  auVar1 = _DAT_0011b8b0;
  lVar5 = 0;
  do {
    bVar7 = (bool)(bVar7 & ABS(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar5] -
                               *(double *)(*pauVar4 + lVar5 * 8)) <= 1e-06);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xb);
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_100 = std::
              _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:308:37)>
              ::_M_invoke;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)std::
                _Function_handler<void_(const_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mkstoyanov[P]TASMANIAN/DREAM/Optimization/tasdreamOptimizationTests.cpp:308:37)>
                ::_M_manager;
  lVar5 = 0;
  auVar9 = _DAT_0011b8a0;
  do {
    if (SUB164(auVar9 ^ auVar1,4) == -0x80000000 && SUB164(auVar9 ^ auVar1,0) < -0x7ffffffb) {
      *(double *)(*pauVar4 + lVar5 * 8) = (double)(int)lVar5 * -0.1 + 0.5;
      *(double *)(*pauVar4 + lVar5 * 8 + 8) = (double)((int)lVar5 + 1) * -0.1 + 0.5;
    }
    lVar5 = lVar5 + 2;
    lVar10 = auVar9._8_8_;
    auVar9._0_8_ = auVar9._0_8_ + 2;
    auVar9._8_8_ = lVar10 + 2;
  } while (lVar5 != 6);
  local_f8 = (undefined1  [8])0x3ff0000000000000;
  GradientDescentState::setX
            ((GradientDescentState *)local_f8,(vector<double,_std::allocator<double>_> *)local_a8);
  TasOptimization::GradientDescent
            (local_68._M_pod_data,local_88._M_pod_data,(function *)&local_118,1.5,1.25,300,1e-06,
             (GradientDescentState *)local_f8);
  std::vector<double,_std::allocator<double>_>::vector(&local_d8,&local_f0);
  pdVar3 = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pdVar2 = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((pdVar2 != (pointer)0x0) &&
     (operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2),
     local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start != (pointer)0x0)) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar5 = 0;
  do {
    bVar7 = (bool)(bVar7 & ABS(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar5] -
                               *(double *)(*pauVar4 + lVar5 * 8)) <= 1e-06);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xb);
  iVar6 = 300;
  do {
    TasOptimization::GradientDescent
              (local_68._M_pod_data,local_88._M_pod_data,(function *)&local_118,1.5,1.25,1,1e-06,
               (GradientDescentState *)local_f8);
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  std::vector<double,_std::allocator<double>_>::vector(&local_d8,&local_f0);
  pauVar4 = local_b8;
  pdVar3 = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pdVar2 = local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((pdVar2 != (pointer)0x0) &&
     (operator_delete(pdVar2,(long)pdVar3 - (long)pdVar2),
     local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
     _M_start != (pointer)0x0)) {
    operator_delete(local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  lVar5 = 0;
  do {
    bVar7 = (bool)(bVar7 & ABS(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[lVar5] -
                               *(double *)(*pauVar4 + lVar5 * 8)) <= 1e-06);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xb);
  if (bVar7 != true || (char)local_ac != '\0') {
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0x14;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Gradient Descent",0x10);
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0x1e;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Algorithm Unit Tests",0x14);
    *(undefined8 *)(&TasDREAM::LikelihoodGaussIsotropic::vtable + *(long *)(std::cout + -0x18)) =
         0xf;
    pcVar8 = "FAIL";
    if (bVar7 != false) {
      pcVar8 = "Pass";
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,4);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage != (pointer)0x0) {
    (*(code *)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage)(&local_118,&local_118,3);
  }
  if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_,(long)local_98 - local_a8._0_8_);
  }
  operator_delete(pauVar4,0x58);
  if ((code *)local_78._0_8_ != (code *)0x0) {
    (*(code *)local_78._0_8_)(&local_88,&local_88,__destroy_functor);
  }
  if ((code *)local_58._0_8_ != (code *)0x0) {
    (*(code *)local_58._0_8_)(&local_68,&local_68,__destroy_functor);
  }
  return bVar7;
}

Assistant:

bool testGradientDescent(bool verbose) {
    test_result test;

    // Nesterov's "worst function in the world".
    ObjectiveFunctionSingle func;
    GradientFunctionSingle grad;
    double L = 10;
    int num_dimensions = 11;
    std::vector<double> x_optimal(num_dimensions);
    makeNesterovTestFunction(L, (num_dimensions-1)/2, func, grad, x_optimal);

    // Constant stepsize gradient descent.
    std::vector<double> x0(num_dimensions, 0);
    GradientDescentState state(x0, 0);
    GradientDescent(grad, 1.0/L, 300, 1E-6, state);
    std::vector<double> x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);
    state.setX(x0);
    for (int t=0; t<300; t++) GradientDescent(grad, 1.0/L, 1, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);

    // Variable stepsize gradient descent.
    state.setAdaptiveStepsize(10.0/L);
    state.setX(x0);
    GradientDescent(func, grad, 1.5, 1.25, 300, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);
    state.setX(x0);
    for (int t=0; t<300; t++) GradientDescent(func, grad, 1.5, 1.25, 1, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);

    // Proximal/Projected gradient descent (optimum now lies on the boundary).
    ProjectionFunctionSingle proj = [](const std::vector<double> &x, std::vector<double> &p) {
        for (size_t i=0; i<p.size(); i++) p[i] = std::min(std::max(x[i], -0.5), 0.5);
    };
    for (int i=0; i<(num_dimensions-1)/2; i++) x_optimal[i] = 0.5 - 0.1 * i;
    state.setAdaptiveStepsize(10.0/L);
    state.setX(x0);
    GradientDescent(func, grad, proj, 1.5, 1.25, 300, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);
    for (int t=0; t<300; t++) GradientDescent(func, grad, proj, 1.5, 1.25, 1, 1E-6, state);
    x_gd = state.getX();
    for (int i=0; i<num_dimensions; i++) test.tassert(std::abs(x_gd[i] - x_optimal[i]) <= 1E-6);

    // Reporting.
    if (test.failed_any() or verbose) reportPassFail(test.success(), "Gradient Descent", "Algorithm Unit Tests");
    return test.success();
}